

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O2

string * XPMP2::SocketNetworking::GetLastErr_abi_cxx11_(void)

{
  int *piVar1;
  string *in_RDI;
  allocator<char> local_79;
  char sErr [100];
  
  piVar1 = __errno_location();
  strerror_r(*piVar1,sErr,100);
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,sErr,&local_79);
  return in_RDI;
}

Assistant:

std::string SocketNetworking::GetLastErr()
{
    char sErr[SERR_LEN];
#if IBM
    FormatMessage(FORMAT_MESSAGE_FROM_SYSTEM | FORMAT_MESSAGE_IGNORE_INSERTS,   // flags
        NULL,                                                                   // lpsource
        WSAGetLastError(),                                                      // message id
        MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT),                              // languageid
        sErr,                                                                   // output buffer
        sizeof(sErr),                                                           // size of msgbuf, bytes
        NULL);
#else
    strerror_s(sErr, sizeof(sErr), errno);
#endif
    return std::string(sErr);
}